

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CheckVisibilityRulesVisit
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto,
          VisibilityCheckerState *state)

{
  bool bVar1;
  vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  *this_00;
  EnumDescriptorAndProto local_28;
  
  if (enm->containing_type_ != (Descriptor *)0x0) {
    bVar1 = IsEnumNamespaceMessage(this,enm);
    if (bVar1) {
      this_00 = &state->namespaced_enums;
    }
    else {
      this_00 = &state->nested_enums;
    }
    local_28.descriptor = enm;
    local_28.proto = proto;
    std::
    vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
    ::emplace_back<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>(this_00,&local_28);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckVisibilityRulesVisit(
    const EnumDescriptor& enm, const EnumDescriptorProto& proto,
    VisibilityCheckerState& state) {
  if (enm.containing_type() != nullptr) {
    if (IsEnumNamespaceMessage(enm)) {
      state.namespaced_enums.push_back(EnumDescriptorAndProto{&enm, &proto});
    } else {
      state.nested_enums.push_back(EnumDescriptorAndProto{&enm, &proto});
    }
  }
}